

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_avx512_mula2(uint16_t *data,uint32_t len,uint32_t *flags)

{
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  int j_1;
  __m128i dq3;
  __m128i dq2;
  __m128i dq1;
  __m128i dq0;
  int j;
  __m512i sum_bf;
  __m512i sum_ae;
  __m512i sum_9d;
  __m512i sum_8c;
  __m512i sum_37;
  __m512i sum_26;
  __m512i sum_15;
  __m512i sum_04;
  __m512i bits_bf;
  __m512i bits_ae;
  __m512i bits_9d;
  __m512i bits_8c;
  __m512i bits_37;
  __m512i bits_26;
  __m512i bits_15;
  __m512i bits_04;
  __m512i input1;
  __m512i input0;
  __m512i v1;
  __m512i v0;
  size_t i;
  int i_1;
  __m512i sum [16];
  uint32_t n_cycles;
  __m512i *data_vectors;
  int local_3314;
  int local_32c4;
  ulong local_2d90;
  int local_2d84;
  undefined1 local_2d80 [64];
  undefined1 local_2d40 [64];
  undefined1 local_2d00 [64];
  undefined1 local_2cc0 [64];
  undefined1 local_2c80 [64];
  undefined1 local_2c40 [64];
  undefined1 local_2c00 [64];
  undefined1 local_2bc0 [64];
  undefined1 local_2b80 [64];
  undefined1 local_2b40 [64];
  undefined1 local_2b00 [64];
  undefined1 local_2ac0 [64];
  undefined1 local_2a80 [64];
  undefined1 local_2a40 [64];
  undefined1 local_2a00 [64];
  undefined1 local_29c0 [64];
  uint local_2974;
  
  local_2974 = in_ESI >> 5;
  for (local_2d84 = 0; local_2d84 < 0x10; local_2d84 = local_2d84 + 1) {
    auVar1 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    *(undefined1 (*) [64])(local_2d80 + (long)local_2d84 * 0x40) = auVar1;
  }
  for (local_2d90 = 0; local_2d90 + 2 <= (ulong)(in_ESI >> 5); local_2d90 = local_2d90 + 2) {
    auVar1 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_2d90 * 0x40));
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + 0x40 + local_2d90 * 0x40));
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar1);
    auVar4 = vpbroadcastw_avx512bw(ZEXT216(0xff));
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar5 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar5);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vpandq_avx512f(auVar4,auVar3);
    auVar4 = vmovdqa64_avx512f(auVar2);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar5 = vpsllw_avx512bw(auVar4,ZEXT416(8));
    auVar4 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar5);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar4 = vporq_avx512f(auVar4,auVar3);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar3 = vmovdqa64_avx512f(auVar1);
    auVar1 = vpbroadcastw_avx512bw(ZEXT216(0xff00));
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar5 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar5);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vpandq_avx512f(auVar1,auVar3);
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vpsrlw_avx512bw(auVar1,ZEXT416(8));
    auVar1 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vporq_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar3 = vmovdqa64_avx512f(auVar4);
    auVar2 = vpbroadcastw_avx512bw(ZEXT216(0x1111));
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar5 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar5);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandq_avx512f(auVar2,auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar4);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar5 = vpsrld_avx512f(auVar3,ZEXT416(1));
    auVar3 = vpbroadcastw_avx512bw(ZEXT216(0x1111));
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar6 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar6);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar3 = vpandq_avx512f(auVar3,auVar5);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar5 = vmovdqa64_avx512f(auVar4);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vpsrld_avx512f(auVar5,ZEXT416(2));
    auVar5 = vpbroadcastw_avx512bw(ZEXT216(0x1111));
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar7 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar6);
    auVar6 = vmovdqa64_avx512f(auVar7);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar5 = vpandq_avx512f(auVar5,auVar6);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar6 = vpsrld_avx512f(auVar4,ZEXT416(3));
    auVar4 = vpbroadcastw_avx512bw(ZEXT216(0x1111));
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar7 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(auVar6);
    auVar6 = vmovdqa64_avx512f(auVar7);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar4 = vpandq_avx512f(auVar4,auVar6);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar7 = vmovdqa64_avx512f(auVar1);
    auVar6 = vpbroadcastw_avx512bw(ZEXT216(0x1111));
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar8 = vmovdqa64_avx512f(auVar6);
    auVar6 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar8);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar6 = vpandq_avx512f(auVar6,auVar7);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar7 = vmovdqa64_avx512f(auVar1);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar8 = vpsrld_avx512f(auVar7,ZEXT416(1));
    auVar7 = vpbroadcastw_avx512bw(ZEXT216(0x1111));
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar9 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(auVar9);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar7 = vpandq_avx512f(auVar7,auVar8);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar8 = vmovdqa64_avx512f(auVar1);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar9 = vpsrld_avx512f(auVar8,ZEXT416(2));
    auVar8 = vpbroadcastw_avx512bw(ZEXT216(0x1111));
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar10 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar10);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar8 = vpandq_avx512f(auVar8,auVar9);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar9 = vpsrld_avx512f(auVar1,ZEXT416(3));
    auVar1 = vpbroadcastw_avx512bw(ZEXT216(0x1111));
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar10 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar10);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar1 = vpandq_avx512f(auVar1,auVar9);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar9 = vmovdqa64_avx512f(auVar2);
    auVar12 = ZEXT1664((undefined1  [16])0x0);
    auVar2 = vmovdqa64_avx512f(auVar12);
    auVar10 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar10);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar2 = vpsadbw_avx512bw(auVar2,auVar9);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar9 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar12);
    auVar10 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar10);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar3 = vpsadbw_avx512bw(auVar3,auVar9);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar9 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar12);
    auVar10 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar10);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar5 = vpsadbw_avx512bw(auVar5,auVar9);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar9 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(auVar12);
    auVar10 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar10);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar4 = vpsadbw_avx512bw(auVar4,auVar9);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar9 = vmovdqa64_avx512f(auVar6);
    auVar6 = vmovdqa64_avx512f(auVar12);
    auVar10 = vmovdqa64_avx512f(auVar6);
    auVar6 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar10);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar6 = vpsadbw_avx512bw(auVar6,auVar9);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar9 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar12);
    auVar10 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar10);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar7 = vpsadbw_avx512bw(auVar7,auVar9);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar9 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(auVar12);
    auVar10 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar10);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar8 = vpsadbw_avx512bw(auVar8,auVar9);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar9 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar12);
    auVar10 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar10);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar1 = vpsadbw_avx512bw(auVar1,auVar9);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar12 = vmovdqa64_avx512f(local_2d80);
    auVar10 = vmovdqa64_avx512f(auVar2);
    auVar9 = vpbroadcastq_avx512f(ZEXT816(0xf));
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar11 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar10);
    auVar10 = vmovdqa64_avx512f(auVar11);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar10 = vpandq_avx512f(auVar9,auVar10);
    auVar9 = vmovdqa64_avx512f(auVar12);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar9 = vpaddq_avx512f(auVar9,auVar10);
    local_2d80 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(local_2c80);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar10 = vpsrld_avx512f(auVar2,ZEXT416(4));
    auVar2 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar10);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar2 = vpaddq_avx512f(auVar2,auVar9);
    local_2c80 = vmovdqa64_avx512f(auVar2);
    auVar10 = vmovdqa64_avx512f(local_2d40);
    auVar9 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpbroadcastq_avx512f(ZEXT816(0xf));
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar12 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar12);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar9 = vpandq_avx512f(auVar2,auVar9);
    auVar2 = vmovdqa64_avx512f(auVar10);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar2 = vpaddq_avx512f(auVar2,auVar9);
    local_2d40 = vmovdqa64_avx512f(auVar2);
    auVar9 = vmovdqa64_avx512f(local_2c40);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vpsrld_avx512f(auVar2,ZEXT416(4));
    auVar2 = vmovdqa64_avx512f(auVar9);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpaddq_avx512f(auVar2,auVar3);
    local_2c40 = vmovdqa64_avx512f(auVar2);
    auVar9 = vmovdqa64_avx512f(local_2d00);
    auVar3 = vmovdqa64_avx512f(auVar5);
    auVar2 = vpbroadcastq_avx512f(ZEXT816(0xf));
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar10 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar10);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vpandq_avx512f(auVar2,auVar3);
    auVar2 = vmovdqa64_avx512f(auVar9);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpaddq_avx512f(auVar2,auVar3);
    local_2d00 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(local_2c00);
    auVar2 = vmovdqa64_avx512f(auVar5);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar5 = vpsrld_avx512f(auVar2,ZEXT416(4));
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar5);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpaddq_avx512f(auVar2,auVar3);
    local_2c00 = vmovdqa64_avx512f(auVar2);
    auVar5 = vmovdqa64_avx512f(local_2cc0);
    auVar3 = vmovdqa64_avx512f(auVar4);
    auVar2 = vpbroadcastq_avx512f(ZEXT816(0xf));
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar9 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar9);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vpandq_avx512f(auVar2,auVar3);
    auVar2 = vmovdqa64_avx512f(auVar5);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpaddq_avx512f(auVar2,auVar3);
    local_2cc0 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(local_2bc0);
    auVar2 = vmovdqa64_avx512f(auVar4);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar4 = vpsrld_avx512f(auVar2,ZEXT416(4));
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar2 = vpaddq_avx512f(auVar2,auVar4);
    local_2bc0 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(local_2b80);
    auVar4 = vmovdqa64_avx512f(auVar6);
    auVar2 = vpbroadcastq_avx512f(ZEXT816(0xf));
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar5 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(auVar5);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar4 = vpandq_avx512f(auVar2,auVar4);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar2 = vpaddq_avx512f(auVar2,auVar4);
    local_2b80 = vmovdqa64_avx512f(auVar2);
    auVar4 = vmovdqa64_avx512f(local_2a80);
    auVar2 = vmovdqa64_avx512f(auVar6);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vpsrld_avx512f(auVar2,ZEXT416(4));
    auVar2 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar2 = vpaddq_avx512f(auVar2,auVar4);
    local_2a80 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(local_2b40);
    auVar4 = vmovdqa64_avx512f(auVar7);
    auVar2 = vpbroadcastq_avx512f(ZEXT816(0xf));
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar5 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(auVar5);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar4 = vpandq_avx512f(auVar2,auVar4);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar2 = vpaddq_avx512f(auVar2,auVar4);
    local_2b40 = vmovdqa64_avx512f(auVar2);
    auVar4 = vmovdqa64_avx512f(local_2a40);
    auVar2 = vmovdqa64_avx512f(auVar7);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vpsrld_avx512f(auVar2,ZEXT416(4));
    auVar2 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar2 = vpaddq_avx512f(auVar2,auVar4);
    local_2a40 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(local_2b00);
    auVar4 = vmovdqa64_avx512f(auVar8);
    auVar2 = vpbroadcastq_avx512f(ZEXT816(0xf));
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar5 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(auVar5);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar4 = vpandq_avx512f(auVar2,auVar4);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar2 = vpaddq_avx512f(auVar2,auVar4);
    local_2b00 = vmovdqa64_avx512f(auVar2);
    auVar4 = vmovdqa64_avx512f(local_2a00);
    auVar2 = vmovdqa64_avx512f(auVar8);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vpsrld_avx512f(auVar2,ZEXT416(4));
    auVar2 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar2 = vpaddq_avx512f(auVar2,auVar4);
    local_2a00 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(local_2ac0);
    auVar4 = vmovdqa64_avx512f(auVar1);
    auVar2 = vpbroadcastq_avx512f(ZEXT816(0xf));
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar5 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(auVar5);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar4 = vpandq_avx512f(auVar2,auVar4);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpaddq_avx512f(auVar2,auVar4);
    local_2ac0 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(local_29c0);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar4 = vpsrld_avx512f(auVar1,ZEXT416(4));
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar4);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vpaddq_avx512f(auVar1,auVar2);
    local_29c0 = vmovdqa64_avx512f(auVar1);
  }
  for (local_32c4 = 0; local_32c4 < 0x10; local_32c4 = local_32c4 + 1) {
    *(int *)(in_RDX + (long)local_32c4 * 4) =
         (int)*(undefined8 *)(local_2d80 + (long)local_32c4 * 0x40) +
         (int)*(undefined8 *)(local_2d80 + (long)local_32c4 * 0x40 + 8) +
         (int)*(undefined8 *)(local_2d80 + (long)local_32c4 * 0x40 + 0x10) +
         (int)*(undefined8 *)(local_2d80 + (long)local_32c4 * 0x40 + 0x18) +
         (int)*(undefined8 *)(local_2d80 + (long)local_32c4 * 0x40 + 0x20) +
         (int)*(undefined8 *)(local_2d40 + (long)local_32c4 * 0x40 + -0x18) +
         (int)*(undefined8 *)(local_2d40 + (long)local_32c4 * 0x40 + -0x10) +
         (int)*(undefined8 *)(local_2d40 + (long)local_32c4 * 0x40 + -8);
  }
  for (local_2d90 = local_2d90 << 5; local_2d90 < in_ESI; local_2d90 = local_2d90 + 1) {
    for (local_3314 = 0; local_3314 < 0x10; local_3314 = local_3314 + 1) {
      *(int *)(in_RDX + (long)local_3314 * 4) =
           ((int)((uint)*(ushort *)(in_RDI + local_2d90 * 2) & 1 << ((byte)local_3314 & 0x1f)) >>
           ((byte)local_3314 & 0x1f)) + *(int *)(in_RDX + (long)local_3314 * 4);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx512_mula2(const uint16_t* data, uint32_t len, uint32_t* flags) {
    const __m512i* data_vectors = (const __m512i*)(data);
    const uint32_t n_cycles = len / 32;

    __m512i sum[16];
    for (int i=0; i < 16; ++i)
        sum[i] = _mm512_setzero_si512();

    size_t i = 0;
    for (/**/; i + 2 <= n_cycles; i += 2) {
        __m512i v0 = _mm512_loadu_si512(data_vectors + i);
        __m512i v1 = _mm512_loadu_si512(data_vectors + i + 1);

        __m512i input0 = _mm512_or_si512(_mm512_and_si512(v0, _mm512_set1_epi16(0x00FF)), _mm512_slli_epi16(v1, 8));
        __m512i input1 = _mm512_or_si512(_mm512_and_si512(v0, _mm512_set1_epi16((int16_t)0xFF00)), _mm512_srli_epi16(v1, 8));
        
        const __m512i bits_04 = _mm512_and_si512(input0, _mm512_set1_epi16(0x1111));
        const __m512i bits_15 = _mm512_and_si512(_mm512_srli_epi32(input0, 1), _mm512_set1_epi16(0x1111)); // 00010001 00010001
        const __m512i bits_26 = _mm512_and_si512(_mm512_srli_epi32(input0, 2), _mm512_set1_epi16(0x1111));
        const __m512i bits_37 = _mm512_and_si512(_mm512_srli_epi32(input0, 3), _mm512_set1_epi16(0x1111));

        const __m512i bits_8c = _mm512_and_si512(input1, _mm512_set1_epi16(0x1111));
        const __m512i bits_9d = _mm512_and_si512(_mm512_srli_epi32(input1, 1), _mm512_set1_epi16(0x1111));
        const __m512i bits_ae = _mm512_and_si512(_mm512_srli_epi32(input1, 2), _mm512_set1_epi16(0x1111));
        const __m512i bits_bf = _mm512_and_si512(_mm512_srli_epi32(input1, 3), _mm512_set1_epi16(0x1111));

        const __m512i sum_04 = _mm512_sad_epu8(bits_04, _mm512_setzero_si512());
        const __m512i sum_15 = _mm512_sad_epu8(bits_15, _mm512_setzero_si512());
        const __m512i sum_26 = _mm512_sad_epu8(bits_26, _mm512_setzero_si512());
        const __m512i sum_37 = _mm512_sad_epu8(bits_37, _mm512_setzero_si512());

        const __m512i sum_8c = _mm512_sad_epu8(bits_8c, _mm512_setzero_si512());
        const __m512i sum_9d = _mm512_sad_epu8(bits_9d, _mm512_setzero_si512());
        const __m512i sum_ae = _mm512_sad_epu8(bits_ae, _mm512_setzero_si512());
        const __m512i sum_bf = _mm512_sad_epu8(bits_bf, _mm512_setzero_si512());

        sum[0x0] = _mm512_add_epi64(sum[0x0], _mm512_and_si512 (sum_04, _mm512_set1_epi64(0xF))); // 00001111
        sum[0x4] = _mm512_add_epi64(sum[0x4], _mm512_srli_epi32(sum_04, 4));
        sum[0x1] = _mm512_add_epi64(sum[0x1], _mm512_and_si512 (sum_15, _mm512_set1_epi64(0xF)));
        sum[0x5] = _mm512_add_epi64(sum[0x5], _mm512_srli_epi32(sum_15, 4));
        sum[0x2] = _mm512_add_epi64(sum[0x2], _mm512_and_si512 (sum_26, _mm512_set1_epi64(0xF)));
        sum[0x6] = _mm512_add_epi64(sum[0x6], _mm512_srli_epi32(sum_26, 4));
        sum[0x3] = _mm512_add_epi64(sum[0x3], _mm512_and_si512 (sum_37, _mm512_set1_epi64(0xF)));
        sum[0x7] = _mm512_add_epi64(sum[0x7], _mm512_srli_epi32(sum_37, 4));
        sum[0x8] = _mm512_add_epi64(sum[0x8], _mm512_and_si512 (sum_8c, _mm512_set1_epi64(0xF)));
        sum[0xc] = _mm512_add_epi64(sum[0xc], _mm512_srli_epi32(sum_8c, 4));
        sum[0x9] = _mm512_add_epi64(sum[0x9], _mm512_and_si512 (sum_9d, _mm512_set1_epi64(0xF)));
        sum[0xd] = _mm512_add_epi64(sum[0xd], _mm512_srli_epi32(sum_9d, 4));
        sum[0xa] = _mm512_add_epi64(sum[0xa], _mm512_and_si512 (sum_ae, _mm512_set1_epi64(0xF)));
        sum[0xe] = _mm512_add_epi64(sum[0xe], _mm512_srli_epi32(sum_ae, 4));
        sum[0xb] = _mm512_add_epi64(sum[0xb], _mm512_and_si512 (sum_bf, _mm512_set1_epi64(0xF)));
        sum[0xf] = _mm512_add_epi64(sum[0xf], _mm512_srli_epi32(sum_bf, 4));
    }

    for (int j = 0; j < 16; ++j) {
        const __m128i dq0 = _mm512_extracti32x4_epi32(sum[j], 0);
        const __m128i dq1 = _mm512_extracti32x4_epi32(sum[j], 1);
        const __m128i dq2 = _mm512_extracti32x4_epi32(sum[j], 2);
        const __m128i dq3 = _mm512_extracti32x4_epi32(sum[j], 3);
        flags[j] = _mm_extract_epi64(dq0, 0)
                    + _mm_extract_epi64(dq0, 1)
                    + _mm_extract_epi64(dq1, 0)
                    + _mm_extract_epi64(dq1, 1)
                    + _mm_extract_epi64(dq2, 0)
                    + _mm_extract_epi64(dq2, 1)
                    + _mm_extract_epi64(dq3, 0)
                    + _mm_extract_epi64(dq3, 1);
    }

    i *= 32;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((data[i] & (1 << j)) >> j);
        }
    }

    return 0;
}